

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setControlDesiredTrajectory
          (L2NormCost *this,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
          *controlDesiredTrajectory)

{
  L2NormCostImplementation *pLVar1;
  char *pcVar2;
  __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  
  pLVar1 = this->m_pimpl;
  if ((pLVar1->controlCost).m_valid == false) {
    pcVar2 = "The control cost portion has been deactivated, given the provided selectors.";
  }
  else {
    if ((controlDesiredTrajectory->
        super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr != (element_type *)0x0) {
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_20,
                     &controlDesiredTrajectory->
                      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&(pLVar1->controlCost).desiredTrajectory.
                   super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                  ,&local_20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
      return true;
    }
    pcVar2 = "Empty desired trajectory pointer.";
  }
  iDynTree::reportError("L2NormCost","setControlDesiredTrajectory",pcVar2);
  return false;
}

Assistant:

bool L2NormCost::setControlDesiredTrajectory(std::shared_ptr<TimeVaryingVector> controlDesiredTrajectory)
        {
            if (!(m_pimpl->controlCost.isValid())) {
                reportError("L2NormCost", "setControlDesiredTrajectory", "The control cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!controlDesiredTrajectory) {
                reportError("L2NormCost", "setControlDesiredTrajectory", "Empty desired trajectory pointer.");
                return false;
            }

            return m_pimpl->controlCost.setDesiredTrajectory(controlDesiredTrajectory);
        }